

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O0

void __thiscall Am_Style_Data::Am_Style_Data(Am_Style_Data *this,Am_Style_Data *proto)

{
  size_t sVar1;
  char *__dest;
  char *color_hold;
  Am_Style_Data *proto_local;
  Am_Style_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00411658;
  this->color_name = (char *)0x0;
  this->main_display = (Display *)0x0;
  this->color_head = (Color_Index *)0x0;
  this->color_allocated = (bool)(proto->color_allocated & 1);
  this->red = proto->red;
  this->green = proto->green;
  this->blue = proto->blue;
  this->line_thickness = proto->line_thickness;
  this->cap_style = proto->cap_style;
  this->join_style = proto->join_style;
  this->line_solid = proto->line_solid;
  this->dash_list_length = proto->dash_list_length;
  this->fill_solid = proto->fill_solid;
  this->fill_poly = proto->fill_poly;
  Am_Image_Array::Am_Image_Array(&this->stipple_bitmap,&proto->stipple_bitmap);
  memcpy(this->dash_list,proto->dash_list,(long)this->dash_list_length);
  if (proto->color_name != (char *)0x0) {
    sVar1 = strlen(proto->color_name);
    __dest = (char *)operator_new__(sVar1 + 1);
    strcpy(__dest,proto->color_name);
    this->color_name = __dest;
  }
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Style_Data::Am_Style_Data(Am_Style_Data *proto)
    : color_name(nullptr), main_display(nullptr), color_head(nullptr),
      color_allocated(proto->color_allocated), red(proto->red),
      green(proto->green), blue(proto->blue),
      line_thickness(proto->line_thickness), cap_style(proto->cap_style),
      join_style(proto->join_style), line_solid(proto->line_solid),
      dash_list_length(proto->dash_list_length), fill_solid(proto->fill_solid),
      fill_poly(proto->fill_poly), stipple_bitmap(proto->stipple_bitmap)
{
  memcpy(dash_list, proto->dash_list, dash_list_length * sizeof(char));
  if (proto->color_name != nullptr) {
    char *color_hold = new char[strlen(proto->color_name) + 1];
    strcpy(color_hold, proto->color_name);
    color_name = color_hold;
  } // else: color_name already 0L

  next = list;
  list = this;
}